

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

void __thiscall caffe::ImageDataParameter::SharedCtor(ImageDataParameter *this)

{
  this->_cached_size_ = 0;
  (this->source_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  (this->mean_file_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  (this->root_folder_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  this->new_width_ = 0;
  this->crop_size_ = 0;
  this->rand_skip_ = 0;
  this->shuffle_ = false;
  this->mirror_ = false;
  *(undefined2 *)&this->field_0x3a = 0;
  this->new_height_ = 0;
  this->is_color_ = true;
  this->scale_ = 1.0;
  this->batch_size_ = 1;
  return;
}

Assistant:

void ImageDataParameter::SharedCtor() {
  _cached_size_ = 0;
  source_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  mean_file_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  root_folder_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  ::memset(&crop_size_, 0, reinterpret_cast<char*>(&new_width_) -
    reinterpret_cast<char*>(&crop_size_) + sizeof(new_width_));
  is_color_ = true;
  scale_ = 1;
  batch_size_ = 1u;
}